

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_function_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue JVar3;
  int iVar4;
  JSRefCountHeader *p;
  JSContext *pJVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  JSValue obj;
  JSValue func_obj;
  JSValue JVar9;
  JSValue JVar10;
  JSValue v;
  JSValue this_obj;
  StringBuffer local_68;
  JSValueUnion local_48;
  int64_t local_40;
  ulong local_38;
  
  local_40 = new_target.tag;
  local_48 = new_target.u;
  string_buffer_init(ctx,&local_68,0);
  string_buffer_putc8(&local_68,0x28);
  if ((magic & 0xfffffffeU) == 2) {
    string_buffer_puts8(&local_68,"async ");
  }
  string_buffer_puts8(&local_68,"function");
  if ((magic & 0xfffffffdU) == 1) {
    string_buffer_putc8(&local_68,0x2a);
  }
  string_buffer_puts8(&local_68," anonymous(");
  uVar6 = argc - 1;
  lVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar6) {
    uVar8 = (ulong)uVar6;
  }
  local_38 = (ulong)(uint)argc;
  do {
    if (uVar8 * 0x10 == lVar7) {
      string_buffer_puts8(&local_68,"\n) {\n");
      if (((int)local_38 < 1) ||
         (JVar9.tag = argv[uVar6].tag, JVar9.u.ptr = argv[uVar6].u.ptr,
         iVar4 = string_buffer_concat_value(&local_68,JVar9), iVar4 == 0)) {
        string_buffer_puts8(&local_68,"\n})");
        JVar9 = string_buffer_end(&local_68);
        if ((int)JVar9.tag == 6) goto LAB_0012b476;
        JVar10 = JS_EvalObject(ctx,ctx->global_obj,JVar9,3,-1);
        JS_FreeValue(ctx,JVar9);
        iVar2 = local_40;
        JVar1 = local_48;
        if ((int)JVar10.tag == 6) goto LAB_0012b482;
        if ((int)local_40 == 3) {
          return JVar10;
        }
        obj.tag = local_40;
        obj.u.ptr = local_48.ptr;
        this_obj.tag = local_40;
        this_obj.u.ptr = local_48.ptr;
        v = JS_GetPropertyInternal(ctx,obj,0x3b,this_obj,0);
        if ((int)v.tag != -1) {
          if ((int)v.tag == 6) goto LAB_0012b482;
          JS_FreeValue(ctx,v);
          func_obj.tag = iVar2;
          func_obj.u.ptr = JVar1.ptr;
          pJVar5 = JS_GetFunctionRealm(ctx,func_obj);
          if (pJVar5 == (JSContext *)0x0) goto LAB_0012b482;
          JVar1 = (JSValueUnion)pJVar5->class_proto[func_kind_to_class_id[(uint)magic]].u.ptr;
          iVar2 = pJVar5->class_proto[func_kind_to_class_id[(uint)magic]].tag;
          JVar3.tag = iVar2;
          JVar3.u.ptr = JVar1.ptr;
          v.tag = iVar2;
          v.u.ptr = JVar1.ptr;
          if (0xfffffff4 < (uint)iVar2) {
            *(int *)JVar1.ptr = *JVar1.ptr + 1;
            v = JVar3;
          }
        }
        iVar4 = JS_SetPrototypeInternal(ctx,JVar10,v,1);
        JS_FreeValue(ctx,v);
        if (-1 < iVar4) {
          return JVar10;
        }
        goto LAB_0012b482;
      }
      break;
    }
    if (lVar7 != 0) {
      string_buffer_putc8(&local_68,0x2c);
    }
    JVar10.tag = *(int64_t *)((long)&argv->tag + lVar7);
    JVar10.u.ptr = ((JSValueUnion *)((long)&argv->u + lVar7))->ptr;
    iVar4 = string_buffer_concat_value(&local_68,JVar10);
    lVar7 = lVar7 + 0x10;
  } while (iVar4 == 0);
  (*((local_68.ctx)->rt->mf).js_free)(&(local_68.ctx)->rt->malloc_state,local_68.str);
LAB_0012b476:
  JVar10 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0012b482:
  JS_FreeValue(ctx,JVar10);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_function_constructor(JSContext *ctx, JSValueConst new_target,
                                       int argc, JSValueConst *argv, int magic)
{
    JSFunctionKindEnum func_kind = magic;
    int i, n, ret;
    JSValue s, proto, obj = JS_UNDEFINED;
    StringBuffer b_s, *b = &b_s;

    string_buffer_init(ctx, b, 0);
    string_buffer_putc8(b, '(');
    
    if (func_kind == JS_FUNC_ASYNC || func_kind == JS_FUNC_ASYNC_GENERATOR) {
        string_buffer_puts8(b, "async ");
    }
    string_buffer_puts8(b, "function");

    if (func_kind == JS_FUNC_GENERATOR || func_kind == JS_FUNC_ASYNC_GENERATOR) {
        string_buffer_putc8(b, '*');
    }
    string_buffer_puts8(b, " anonymous(");

    n = argc - 1;
    for(i = 0; i < n; i++) {
        if (i != 0) {
            string_buffer_putc8(b, ',');
        }
        if (string_buffer_concat_value(b, argv[i]))
            goto fail;
    }
    string_buffer_puts8(b, "\n) {\n");
    if (n >= 0) {
        if (string_buffer_concat_value(b, argv[n]))
            goto fail;
    }
    string_buffer_puts8(b, "\n})");
    s = string_buffer_end(b);
    if (JS_IsException(s))
        goto fail1;

    obj = JS_EvalObject(ctx, ctx->global_obj, s, JS_EVAL_TYPE_INDIRECT, -1);
    JS_FreeValue(ctx, s);
    if (JS_IsException(obj))
        goto fail1;
    if (!JS_IsUndefined(new_target)) {
        /* set the prototype */
        proto = JS_GetProperty(ctx, new_target, JS_ATOM_prototype);
        if (JS_IsException(proto))
            goto fail1;
        if (!JS_IsObject(proto)) {
            JSContext *realm;
            JS_FreeValue(ctx, proto);
            realm = JS_GetFunctionRealm(ctx, new_target);
            if (!realm)
                goto fail1;
            proto = JS_DupValue(ctx, realm->class_proto[func_kind_to_class_id[func_kind]]);
        }
        ret = JS_SetPrototypeInternal(ctx, obj, proto, TRUE);
        JS_FreeValue(ctx, proto);
        if (ret < 0)
            goto fail1;
    }
    return obj;

 fail:
    string_buffer_free(b);
 fail1:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}